

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLoader.c
# Opt level: O1

DATA_LOADER * MemoryLoader_Init(UINT8 *buffer,UINT32 length)

{
  DATA_LOADER *loader;
  void *context;
  
  loader = (DATA_LOADER *)calloc(1,0x28);
  if (loader != (DATA_LOADER *)0x0) {
    context = calloc(1,0x90);
    if (context != (void *)0x0) {
      *(UINT8 **)((long)context + 8) = buffer;
      *(UINT32 *)((long)context + 4) = length;
      *(undefined4 *)((long)context + 0x10) = 0;
      DataLoader_Setup(loader,&memoryLoader,context);
      return loader;
    }
    free(loader);
  }
  return (DATA_LOADER *)0x0;
}

Assistant:

DATA_LOADER *MemoryLoader_Init(const UINT8 *buffer, UINT32 length)
{
	DATA_LOADER *dLoader;
	MEMORY_LOADER *mLoader;

	dLoader = (DATA_LOADER *)calloc(1, sizeof(DATA_LOADER));
	if(dLoader == NULL) return NULL;

	mLoader = (MEMORY_LOADER *)calloc(1, sizeof(MEMORY_LOADER));
	if(mLoader == NULL)
	{
		free(dLoader);
		return NULL;
	}

	mLoader->srcData = buffer;
	mLoader->srcSize = length;
	mLoader->decSize = 0;

	DataLoader_Setup(dLoader,&memoryLoader,mLoader);

	return dLoader;
}